

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O1

void cluster_linearize_tests::(anonymous_namespace)::
     TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
               (Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster,string *hexenc)

{
  pointer ppVar1;
  pointer pEVar2;
  pointer pEVar3;
  int iVar4;
  uint uVar5;
  iterator pvVar6;
  uint uVar7;
  iterator pvVar8;
  uint uVar9;
  iterator in_R8;
  iterator in_R9;
  iterator pvVar10;
  uint ancestor;
  uint uVar11;
  uint uVar12;
  iterator pvVar13;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar16;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  VectorWriter writer_1;
  shared_count sStack_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  VectorWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoding;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph_read;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  SpanReader reader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph(&depgraph,cluster);
  bVar14 = (long)depgraph.entries.
                 super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)depgraph.entries.
                 super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0;
  if (!bVar14) {
    pvVar6 = (iterator)
             (((long)depgraph.entries.
                     super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)depgraph.entries.
                     super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    pvVar8 = (iterator)0x0;
    do {
      uVar5 = depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].ancestors.m_val;
      in_R8 = (iterator)(ulong)uVar5;
      if ((uVar5 >> ((uint)pvVar8 & 0x1f) & 1) == 0) {
        __assert_fail("depgraph.Ancestors(i)[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x108,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if (uVar5 != 0) {
        uVar9 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        do {
          in_R9 = (iterator)(ulong)uVar9;
          if ((depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)in_R9].ancestors.m_val & ~uVar5) != 0
             ) {
            __assert_fail("depgraph.Ancestors(i).IsSupersetOf(depgraph.Ancestors(a))",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                          ,0x10b,
                          "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                         );
          }
          uVar12 = (uint)in_R8 - 1 & (uint)in_R8;
          in_R8 = (iterator)(ulong)uVar12;
          uVar9 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
        } while (uVar12 != 0);
      }
      pvVar8 = (iterator)(ulong)((uint)pvVar8 + 1);
    } while (pvVar8 <= pvVar6 && (long)pvVar6 - (long)pvVar8 != 0);
    if (depgraph.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        depgraph.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar8 = (iterator)0x0;
      do {
        uVar5 = depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].ancestors.m_val;
        in_R8 = (iterator)(ulong)uVar5;
        in_R9 = (iterator)0x1;
        pvVar13 = (iterator)0x0;
        do {
          pvVar10 = in_R9;
          if (((uVar5 >> ((int)pvVar10 - 1U & 0x1f) & 1) != 0) !=
              ((depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pvVar13].descendants.m_val &
               1 << ((byte)pvVar8 & 0x1f)) != 0)) {
            __assert_fail("depgraph.Ancestors(i)[j] == depgraph.Descendants(j)[i]",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                          ,0x111,
                          "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                         );
          }
          in_R9 = (iterator)(ulong)((int)pvVar10 + 1);
          pvVar13 = pvVar10;
        } while (pvVar10 <= pvVar6 && (long)pvVar6 - (long)pvVar10 != 0);
        pvVar8 = (iterator)(ulong)((int)pvVar8 + 1);
      } while (pvVar8 <= pvVar6 && (long)pvVar6 - (long)pvVar8 != 0);
      if (depgraph.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          depgraph.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if ((((depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start)->descendants).m_val &
            ((depgraph.entries.
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start)->ancestors).m_val) == 1) {
          uVar5 = 1;
          do {
            pvVar8 = (iterator)(ulong)uVar5;
            bVar15 = (long)pvVar6 - (long)pvVar8 == 0;
            bVar14 = pvVar6 < pvVar8 || bVar15;
            if (pvVar6 < pvVar8 || bVar15) goto LAB_0031bf70;
            uVar9 = 1 << ((byte)uVar5 & 0x1f);
            in_R8 = (iterator)(ulong)uVar9;
            uVar5 = uVar5 + 1;
          } while ((depgraph.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].descendants.m_val &
                   depgraph.entries.
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pvVar8].ancestors.m_val) == uVar9
                  );
        }
        goto LAB_0031c151;
      }
    }
  }
LAB_0031bf70:
  if (bVar14) {
    writer_1.vchData = &ser;
    ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    writer_1.nPos = 0;
    ::(anonymous_namespace)::DepGraphFormatter::
    Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer_1,&depgraph);
    reader.m_data.m_size =
         (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    reader.m_data.m_data =
         ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70._0_8_ = &depgraph_read;
    SpanReader::operator>>
              (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                        *)&local_70);
    if (((long)depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
         (long)depgraph_read.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)depgraph_read.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start) ||
       (bVar14 = std::__equal<false>::
                 equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                           (depgraph.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            depgraph.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            depgraph_read.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start),
       pEVar3 = depgraph_read.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
       pEVar2 = depgraph_read.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start, !bVar14)) {
      __assert_fail("depgraph == decoded_depgraph",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x11c,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    if (reader.m_data.m_size != 0) {
      __assert_fail("reader.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x11d,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    if ((ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start) ||
       (ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] != '\0')) {
      __assert_fail("ser.size() >= 1 && ser.back() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x120,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    reader.m_data.m_size =
         (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    reader.m_data.m_data =
         ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depgraph_read.entries.
    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pEVar2 != (pointer)0x0) {
      operator_delete(pEVar2,(long)pEVar3 - (long)pEVar2);
    }
    local_70._0_8_ = &depgraph_read;
    SpanReader::operator>>
              (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                        *)&local_70);
    if (((long)depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)depgraph.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
         (long)depgraph_read.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)depgraph_read.entries.
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start) ||
       (bVar14 = std::__equal<false>::
                 equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                           (depgraph.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            depgraph.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            depgraph_read.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start), !bVar14)) {
      __assert_fail("depgraph == decoded_depgraph",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x125,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    if (reader.m_data.m_size != 0) {
      __assert_fail("reader.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x126,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    if (depgraph_read.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(depgraph_read.entries.
                      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)depgraph_read.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)depgraph_read.entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
LAB_0031c151:
  ppVar1 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(cluster->
            super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 !=
      (long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("cluster.size() == depgraph.TxCount()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x132,
                  "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  if (depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pvVar8 = (iterator)
             (((long)depgraph.entries.
                     super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)depgraph.entries.
                     super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    uVar5 = 1;
    in_R8 = (iterator)0x0;
    do {
      if ((depgraph.entries.
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)in_R8].feerate.fee !=
           ppVar1[(long)in_R8].first.fee) ||
         (uVar9 = ppVar1[(long)in_R8].first.size, in_R9 = (iterator)(ulong)uVar9,
         depgraph.entries.
         super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
         ._M_impl.super__Vector_impl_data._M_start[(long)in_R8].feerate.size != uVar9)) {
        __assert_fail("depgraph.FeeRate(i) == cluster[i].first",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x135,
                      "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      in_R8 = (iterator)(ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (in_R8 <= pvVar8 && (long)pvVar8 - (long)in_R8 != 0);
    if (depgraph.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        depgraph.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar6 = (iterator)0x0;
      do {
        uVar9 = 1 << ((byte)pvVar6 & 0x1f);
        uVar5 = uVar9;
        do {
          uVar12 = uVar5;
          if (uVar5 != 0) {
            uVar11 = 0;
            uVar7 = uVar5;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            do {
              uVar12 = uVar12 | ppVar1[uVar11].second.m_val;
              uVar7 = uVar7 - 1 & uVar7;
              uVar11 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
            } while (uVar7 != 0);
          }
          bVar14 = uVar5 != uVar12;
          uVar5 = uVar12;
        } while (bVar14);
        in_R9 = (iterator)((long)pvVar6 * 3);
        if (depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)pvVar6].ancestors.m_val != uVar12) {
          __assert_fail("depgraph.Ancestors(i) == ancestors",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                        ,0x144,
                        "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                       );
        }
        if ((uVar12 & uVar9) == 0) {
          __assert_fail("ancestors[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                        ,0x147,
                        "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                       );
        }
        uVar5 = ppVar1[(long)pvVar6].second.m_val;
        in_R8 = (iterator)(ulong)uVar5;
        if (uVar5 != 0) {
          uVar9 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          in_R9 = (iterator)(ulong)uVar9;
          do {
            if ((uVar12 >> ((uint)in_R9 & 0x1f) & 1) == 0) {
              __assert_fail("ancestors[parent]",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                            ,0x14a,
                            "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                           );
            }
            uVar9 = (uint)in_R8 - 1 & (uint)in_R8;
            uVar5 = 0;
            bVar14 = uVar9 != 0;
            if (bVar14) {
              for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (bVar14) {
              in_R9 = (iterator)(ulong)uVar5;
            }
            in_R8 = (iterator)(ulong)uVar9;
          } while (bVar14);
        }
        pvVar6 = (iterator)(ulong)((int)pvVar6 + 1);
      } while (pvVar6 <= pvVar8 && (long)pvVar8 - (long)pvVar6 != 0);
    }
  }
  writer.vchData = &encoding;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.nPos = 0;
  ::(anonymous_namespace)::DepGraphFormatter::
  Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer,&depgraph);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x22;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  writer_1.nPos = writer_1.nPos & 0xffffffffffffff00;
  writer_1.vchData =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&PTR__lazy_ostream_013d3cb0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  s.m_size = (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  s.m_data = encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_((string *)&reader,s);
  if (reader.m_data.m_size == hexenc->_M_string_length) {
    if (reader.m_data.m_size == 0) {
      bVar14 = true;
    }
    else {
      iVar4 = bcmp(reader.m_data.m_data,(hexenc->_M_dataplus)._M_p,reader.m_data.m_size);
      bVar14 = iVar4 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar14;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_78 = "";
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d70;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)depgraph_read.entries.
                        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d70;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar8 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)&writer_1,1,2,REQUIRE,0xe982f1,(size_t)&local_80,0x22,&ser,
             "hexenc",&depgraph_read);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)reader.m_data.m_data != &local_48) {
    operator_delete(reader.m_data.m_data,local_48._M_allocated_capacity + 1);
  }
  reader.m_data.m_size =
       (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depgraph_read.entries.
  super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&depgraph_read;
  SpanReader::operator>>
            (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                      *)&ser);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar16 = 0x31c4ab;
  file_00.m_end = (iterator)0x29;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  if ((long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)depgraph_read.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)depgraph_read.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    _cVar16 = 0x31c4de;
    bVar14 = std::__equal<false>::
             equal<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry_const*>
                       (depgraph.entries.
                        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        depgraph.entries.
                        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        depgraph_read.entries.
                        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar14 = false;
  }
  writer_1.vchData =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       CONCAT71(writer_1.vchData._1_7_,bVar14);
  writer_1.nPos = 0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_70._0_8_ = "depgraph == depgraph_read";
  local_70.m_message.px = (element_type *)0xe98322;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
  ;
  local_190 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&writer_1,(lazy_ostream *)&ser,1,0,WARN,_cVar16,(size_t)&local_198,
             0x29);
  boost::detail::shared_count::~shared_count(&sStack_158);
  if (depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depgraph_read.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)depgraph_read.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (depgraph.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(depgraph.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)depgraph.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)depgraph.entries.
                          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestDepGraphSerialization(const Cluster<SetType>& cluster, const std::string& hexenc)
{
    DepGraph depgraph(cluster);

    // Run normal sanity and correspondence checks, which includes a round-trip test.
    VerifyDepGraphFromCluster(cluster, depgraph);

    // There may be multiple serializations of the same graph, but DepGraphFormatter's serializer
    // only produces one of those. Verify that hexenc matches that canonical serialization.
    std::vector<unsigned char> encoding;
    VectorWriter writer(encoding, 0);
    writer << Using<DepGraphFormatter>(depgraph);
    BOOST_CHECK_EQUAL(HexStr(encoding), hexenc);

    // Test that deserializing that encoding yields depgraph. This is effectively already implied
    // by the round-trip test above (if depgraph is acyclic), but verify it explicitly again here.
    SpanReader reader(encoding);
    DepGraph<SetType> depgraph_read;
    reader >> Using<DepGraphFormatter>(depgraph_read);
    BOOST_CHECK(depgraph == depgraph_read);
}